

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

ostream * Catch::TextFlow::operator<<(ostream *os,Columns *cols)

{
  size_t *psVar1;
  bool bVar2;
  pointer pcVar3;
  string line;
  iterator __begin2;
  iterator __end2;
  char local_a1;
  string local_a0;
  iterator local_80;
  iterator local_58;
  
  Columns::iterator::iterator(&local_80,cols);
  Columns::iterator::iterator(&local_58,cols);
  bVar2 = true;
  do {
    if ((long)local_80.m_iterators.
              super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_80.m_iterators.
              super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)local_58.m_iterators.
              super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58.m_iterators.
              super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      if (local_80.m_iterators.
          super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_80.m_iterators.
          super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001513d7:
        if (local_58.m_iterators.
            super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.m_iterators.
                          super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.m_iterators.
                                super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.m_iterators.
                                super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_80.m_iterators.
            super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.m_iterators.
                          super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.m_iterators.
                                super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.m_iterators.
                                super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        return os;
      }
      psVar1 = &(local_58.m_iterators.
                 super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_lineStart;
      pcVar3 = local_80.m_iterators.
               super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while ((pcVar3->m_lineStart == *psVar1 &&
             (pcVar3->m_column == ((const_iterator *)(psVar1 + -1))->m_column))) {
        pcVar3 = pcVar3 + 1;
        psVar1 = psVar1 + 5;
        if (pcVar3 == local_80.m_iterators.
                      super__Vector_base<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001513d7;
      }
    }
    Columns::iterator::operator*[abi_cxx11_(&local_a0,&local_80);
    if (!bVar2) {
      local_a1 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_a1,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    Columns::iterator::operator++(&local_80);
    bVar2 = false;
  } while( true );
}

Assistant:

std::ostream& operator<<( std::ostream& os, Columns const& cols ) {
            bool first = true;
            for ( auto line : cols ) {
                if ( first ) {
                    first = false;
                } else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }